

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_file_put_contents(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_user_func *pjVar1;
  uint uVar2;
  jx9_io_stream *pStream;
  void *pvVar3;
  jx9_int64 jVar4;
  int iFlags;
  char *pcVar5;
  jx9_value *pjVar6;
  jx9_vm *pVm;
  uint use_include;
  bool bVar7;
  int nLen;
  char *local_40;
  char *zFile;
  
  if ((nArg < 2) || (((*apArg)->iFlags & 1) == 0)) {
    pjVar1 = pCtx->pFunc;
    pVm = pCtx->pVm;
    pcVar5 = "Expecting a file path";
  }
  else {
    zFile = jx9_value_to_string(*apArg,&nLen);
    pVm = pCtx->pVm;
    pStream = jx9VmGetStreamDevice(pVm,&zFile,nLen);
    if (pStream != (jx9_io_stream *)0x0) {
      pcVar5 = jx9_value_to_string(apArg[1],&nLen);
      if (0 < nLen) {
        local_40 = pcVar5;
        if (nArg == 2) {
          bVar7 = true;
          use_include = 0;
          iFlags = 0x1c;
        }
        else {
          pjVar6 = apArg[2];
          jx9MemObjToInteger(pjVar6);
          uVar2 = *(uint *)&pjVar6->x;
          use_include = uVar2 & 1;
          bVar7 = use_include == 0;
          iFlags = (uVar2 & 8) * 2 + 0x1c;
        }
        pcVar5 = zFile;
        if (nArg < 4) {
          pjVar6 = (jx9_value *)0x0;
        }
        else {
          pjVar6 = apArg[3];
        }
        pvVar3 = jx9StreamOpenHandle(pCtx->pVm,pStream,zFile,iFlags,use_include,pjVar6,0,(int *)0x0)
        ;
        if (pvVar3 == (void *)0x0) {
          jx9_context_throw_error_format(pCtx,1,"IO error while opening \'%s\'",pcVar5);
          goto LAB_0013ed37;
        }
        if (pStream->xWrite == (_func_jx9_int64_void_ptr_void_ptr_jx9_int64 *)0x0) {
          jx9_context_throw_error_format
                    (pCtx,1,"Read-only stream(%s): Cannot perform write operation",pStream->zName);
          pjVar6 = pCtx->pRet;
          jx9MemObjRelease(pjVar6);
        }
        else {
          if ((!bVar7) && (pStream->xLock != (_func_int_void_ptr_int *)0x0)) {
            (*pStream->xLock)(pvVar3,1);
          }
          jVar4 = (*pStream->xWrite)(pvVar3,local_40,(long)nLen);
          pjVar6 = pCtx->pRet;
          jx9MemObjRelease(pjVar6);
          if (0 < jVar4) {
            (pjVar6->x).iVal = jVar4;
            uVar2 = 2;
            goto LAB_0013eed0;
          }
        }
        (pjVar6->x).rVal = 0.0;
        uVar2 = 8;
LAB_0013eed0:
        pjVar6->iFlags = pjVar6->iFlags & 0xfffffe90U | uVar2;
        if (pStream->xClose == (_func_void_void_ptr *)0x0) {
          return 0;
        }
        (*pStream->xClose)(pvVar3);
        return 0;
      }
      goto LAB_0013ed37;
    }
    pjVar1 = pCtx->pFunc;
    pcVar5 = "No such stream device, JX9 is returning FALSE";
  }
  jx9VmThrowError(pVm,&pjVar1->sName,2,pcVar5);
LAB_0013ed37:
  pjVar6 = pCtx->pRet;
  jx9MemObjRelease(pjVar6);
  (pjVar6->x).rVal = 0.0;
  pjVar6->iFlags = pjVar6->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_file_put_contents(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int use_include  = FALSE;
	const jx9_io_stream *pStream;
	const char *zFile;
	const char *zData;
	int iOpenFlags;
	void *pHandle;
	int iFlags;
	int nLen;
	
	if( nArg < 2 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting a file path");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the file path */
	zFile = jx9_value_to_string(apArg[0], &nLen);
	/* Point to the target IO stream device */
	pStream = jx9VmGetStreamDevice(pCtx->pVm, &zFile, nLen);
	if( pStream == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "No such stream device, JX9 is returning FALSE");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Data to write */
	zData = jx9_value_to_string(apArg[1], &nLen);
	if( nLen < 1 ){
		/* Nothing to write, return immediately */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Try to open the file in read-write mode */
	iOpenFlags = JX9_IO_OPEN_CREATE|JX9_IO_OPEN_RDWR|JX9_IO_OPEN_TRUNC;
	/* Extract the flags */
	iFlags = 0;
	if( nArg > 2 ){
		iFlags = jx9_value_to_int(apArg[2]);
		if( iFlags & 0x01 /*FILE_USE_INCLUDE_PATH*/){
			use_include = TRUE;
		}
		if( iFlags & 0x08 /* FILE_APPEND */){
			/* If the file already exists, append the data to the file
			 * instead of overwriting it.
			 */
			iOpenFlags &= ~JX9_IO_OPEN_TRUNC;
			/* Append mode */
			iOpenFlags |= JX9_IO_OPEN_APPEND;
		}
	}
	pHandle = jx9StreamOpenHandle(pCtx->pVm, pStream, zFile, iOpenFlags, use_include, 
		nArg > 3 ? apArg[3] : 0, FALSE, FALSE);
	if( pHandle == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_ERR, "IO error while opening '%s'", zFile);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	if( pStream->xWrite ){
		jx9_int64 n;
		if( (iFlags & 0x01/* LOCK_EX */) && pStream->xLock ){
			/* Try to acquire an exclusive lock */
			pStream->xLock(pHandle, 1/* LOCK_EX */);
		}
		/* Perform the write operation */
		n = pStream->xWrite(pHandle, (const void *)zData, nLen);
		if( n < 1 ){
			/* IO error, return FALSE */
			jx9_result_bool(pCtx, 0);
		}else{
			/* Total number of bytes written */
			jx9_result_int64(pCtx, n);
		}
	}else{
		/* Read-only stream */
		jx9_context_throw_error_format(pCtx, JX9_CTX_ERR, 
			"Read-only stream(%s): Cannot perform write operation", 
			pStream ? pStream->zName : "null_stream"
			);
		jx9_result_bool(pCtx, 0);
	}
	/* Close the handle */
	jx9StreamCloseHandle(pStream, pHandle);
	return JX9_OK;
}